

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

SwitchInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::SwitchInst,LLVMBC::Value*&,LLVMBC::BasicBlock*&,unsigned_int&>
          (LLVMContext *this,Value **u,BasicBlock **u_1,uint *u_2)

{
  SwitchInst *this_00;
  
  this_00 = (SwitchInst *)allocate(this,0x98,8);
  if (this_00 != (SwitchInst *)0x0) {
    SwitchInst::SwitchInst(this_00,*u,*u_1,*u_2);
    append_typed_destructor<LLVMBC::SwitchInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}